

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qmdiarea.cpp
# Opt level: O1

QMdiSubWindow * __thiscall
QMdiAreaPrivate::nextVisibleSubWindow
          (QMdiAreaPrivate *this,int increaseFactor,WindowOrder order,int removedIndex,int fromIndex
          )

{
  Data *pDVar1;
  QMdiArea *this_00;
  QPointer<QMdiSubWindow> *pQVar2;
  Data *pDVar3;
  int iVar4;
  Data *pDVar5;
  QObject *pQVar6;
  QObject **ppQVar7;
  int iVar8;
  QMdiSubWindow *pQVar9;
  int iVar10;
  int iVar11;
  Data *pDVar12;
  QObject *pQVar13;
  long in_FS_OFFSET;
  QList<QMdiSubWindow_*> local_58;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  if ((this->childWindows).d.size == 0) {
    pQVar9 = (QMdiSubWindow *)0x0;
    goto LAB_00449778;
  }
  this_00 = *(QMdiArea **)
             &(this->super_QAbstractScrollAreaPrivate).super_QFramePrivate.super_QWidgetPrivate.
              field_0x8;
  local_58.d.size = (qsizetype)&DAT_aaaaaaaaaaaaaaaa;
  local_58.d.d = (Data *)&DAT_aaaaaaaaaaaaaaaa;
  local_58.d.ptr = (QMdiSubWindow **)&DAT_aaaaaaaaaaaaaaaa;
  pQVar6 = (QObject *)0x0;
  subWindowList(&local_58,
                *(QMdiAreaPrivate **)
                 &(this_00->super_QAbstractScrollArea).super_QFrame.super_QWidget.field_0x8,order,
                false);
  if (removedIndex < 0) {
    if ((fromIndex < 0) ||
       (pDVar5 = (Data *)(ulong)(uint)fromIndex, (ulong)local_58.d.size <= pDVar5)) {
      pQVar6 = (QObject *)QMdiArea::currentSubWindow(this_00);
    }
    else {
      pQVar2 = (this->childWindows).d.ptr;
      pDVar12 = pQVar2[(long)pDVar5].wp.d;
      if ((pDVar12 == (Data *)0x0) || (*(int *)(pDVar12 + 4) == 0)) {
        pQVar6 = (QObject *)0x0;
      }
      else {
        pQVar6 = pQVar2[(long)pDVar5].wp.value;
      }
    }
  }
  pDVar5 = (Data *)(ulong)order;
  if (pQVar6 == (QObject *)0x0) {
    if (order == CreationOrder && -1 < removedIndex) {
      pQVar6 = (QObject *)0x0;
      pQVar13 = (QObject *)(ulong)(uint)removedIndex;
      if ((int)local_58.d.size + -1 < removedIndex) {
        pQVar13 = pQVar6;
      }
      pQVar2 = (this->childWindows).d.ptr;
      pDVar5 = pQVar2[(long)pQVar13].wp.d;
      if (pDVar5 != (Data *)0x0) {
        pDVar12 = pDVar5 + 4;
        pDVar5 = (Data *)(ulong)*(uint *)pDVar12;
        if (*(uint *)pDVar12 != 0) {
          ppQVar7 = &pQVar2[(long)pQVar13].wp.value;
          goto LAB_00449685;
        }
        pQVar6 = (QObject *)0x0;
      }
    }
    else {
      ppQVar7 = (QObject **)(local_58.d.ptr + (long)(local_58.d.size + -1));
      pDVar5 = (Data *)local_58.d.size;
LAB_00449685:
      pQVar6 = *ppQVar7;
    }
  }
  if ((Data *)local_58.d.size == (Data *)0x0) {
LAB_004496cb:
    iVar8 = -1;
  }
  else {
    pDVar12 = (Data *)0xfffffffffffffff8;
    do {
      iVar8 = (int)pDVar5;
      pDVar1 = pDVar12 + local_58.d.size * -8;
      if (pDVar1 == (Data *)0xfffffffffffffff8) goto LAB_004496c5;
      pDVar5 = pDVar12 + 8;
      pDVar3 = pDVar12 + 8;
      pDVar12 = pDVar5;
    } while (*(QObject **)((long)local_58.d.ptr + (long)pDVar3) != pQVar6);
    iVar8 = (int)((long)pDVar5 >> 3);
LAB_004496c5:
    if (pDVar1 == (Data *)0xfffffffffffffff8) goto LAB_004496cb;
  }
  iVar10 = iVar8 + increaseFactor;
  iVar4 = (int)local_58.d.size + -1;
  if (increaseFactor < 1) {
    iVar11 = iVar4;
    if ((-1 < iVar10) && (iVar11 = iVar10, iVar4 <= iVar10)) {
      iVar11 = iVar4;
    }
  }
  else {
    iVar11 = 0;
    if ((iVar10 <= iVar4) && (iVar11 = 0, 0 < iVar10)) {
      iVar11 = iVar10;
    }
  }
  do {
    if ((((local_58.d.ptr[iVar11]->super_QWidget).data)->widget_attributes & 0x10000) == 0) break;
    iVar10 = iVar11 + increaseFactor;
    if (increaseFactor < 1) {
      iVar11 = iVar4;
      if ((-1 < iVar10) && (iVar11 = iVar10, iVar4 <= iVar10)) {
        iVar11 = iVar4;
      }
    }
    else {
      iVar11 = 0;
      if ((iVar10 <= iVar4) && (iVar11 = iVar10, iVar10 < 1)) {
        iVar11 = 0;
      }
    }
  } while (iVar11 != iVar8);
  pQVar9 = (QMdiSubWindow *)0x0;
  if ((((local_58.d.ptr[iVar11]->super_QWidget).data)->widget_attributes & 0x10000) == 0) {
    pQVar9 = local_58.d.ptr[iVar11];
  }
  if (&(local_58.d.d)->super_QArrayData != (QArrayData *)0x0) {
    LOCK();
    ((local_58.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
         ((local_58.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if (((local_58.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate(&(local_58.d.d)->super_QArrayData,8,0x10);
    }
  }
LAB_00449778:
  if (*(long *)(in_FS_OFFSET + 0x28) != local_38) {
    __stack_chk_fail();
  }
  return pQVar9;
}

Assistant:

QMdiSubWindow *QMdiAreaPrivate::nextVisibleSubWindow(int increaseFactor, QMdiArea::WindowOrder order,
                                                     int removedIndex, int fromIndex) const
{
    if (childWindows.isEmpty())
        return nullptr;

    Q_Q(const QMdiArea);
    const QList<QMdiSubWindow *> subWindows = q->subWindowList(order);
    QMdiSubWindow *current = nullptr;

    if (removedIndex < 0) {
        if (fromIndex >= 0 && fromIndex < subWindows.size())
            current = childWindows.at(fromIndex);
        else
            current = q->currentSubWindow();
    }

    // There's no current sub-window (removed or deactivated),
    // so we have to pick the last active or the next in creation order.
    if (!current) {
        if (removedIndex >= 0 && order == QMdiArea::CreationOrder) {
            int candidateIndex = -1;
            setIndex(&candidateIndex, removedIndex, 0, subWindows.size() - 1, true);
            current = childWindows.at(candidateIndex);
        } else {
            current = subWindows.back();
        }
    }
    Q_ASSERT(current);

    // Find the index for the current sub-window in the given activation order
    const int indexToCurrent = subWindows.indexOf(current);
    const bool increasing = increaseFactor > 0;

    // and use that index + increseFactor as a candidate.
    int index = -1;
    setIndex(&index, indexToCurrent + increaseFactor, 0, subWindows.size() - 1, increasing);
    Q_ASSERT(index != -1);

    // Try to find another window if the candidate is hidden.
    while (subWindows.at(index)->isHidden()) {
        setIndex(&index, index + increaseFactor, 0, subWindows.size() - 1, increasing);
        if (index == indexToCurrent)
            break;
    }

    if (!subWindows.at(index)->isHidden())
        return subWindows.at(index);
    return nullptr;
}